

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynet.cc
# Opt level: O1

VariableIndex __thiscall
dynet::ComputationGraph::add_input
          (ComputationGraph *this,Dim *d,vector<float,_std::allocator<float>_> *pm,Device *device)

{
  pointer *pppNVar1;
  iterator __position;
  InputNode *this_00;
  VariableIndex VVar2;
  VariableIndex new_node_index;
  VariableIndex local_3c;
  InputNode *local_38;
  
  VVar2 = (VariableIndex)
          ((ulong)((long)(this->nodes).
                         super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(this->nodes).
                        super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>._M_impl.
                        super__Vector_impl_data._M_start) >> 3);
  local_3c = VVar2;
  this_00 = (InputNode *)operator_new(0xa8);
  InputNode::InputNode(this_00,d,pm);
  __position._M_current =
       (this->nodes).super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_38 = this_00;
  if (__position._M_current ==
      (this->nodes).super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<dynet::Node*,std::allocator<dynet::Node*>>::_M_realloc_insert<dynet::Node*>
              ((vector<dynet::Node*,std::allocator<dynet::Node*>> *)this,__position,
               (Node **)&local_38);
  }
  else {
    *__position._M_current = (Node *)this_00;
    pppNVar1 = &(this->nodes).super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppNVar1 = *pppNVar1 + 1;
  }
  (this->nodes).super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>._M_impl.
  super__Vector_impl_data._M_finish[-1]->device = device;
  set_dim_for_new_node(this,&local_3c);
  return VVar2;
}

Assistant:

VariableIndex ComputationGraph::add_input(const Dim& d, const vector<float>& pm, Device *device) {
  VariableIndex new_node_index(nodes.size());
  nodes.push_back(new InputNode(d, pm));
  nodes.back()->device = device;
  set_dim_for_new_node(new_node_index);
  return new_node_index;
}